

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

int right_margin_window_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object window;
  Am_Object local_20;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x68);
  Am_Object::Am_Object(&local_20,pAVar3);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    iVar1 = 0x1d6;
  }
  else {
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x66);
    iVar1 = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x66);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    iVar1 = (iVar1 - iVar2) + -5;
  }
  Am_Object::~Am_Object(&local_20);
  return iVar1;
}

Assistant:

Am_Define_Formula(int, right_margin_window)
{
  Am_Object window = (Am_Object)(self.Get(Am_WINDOW));
  if (window)
    return (int)window.Get(Am_WIDTH) - (int)self.Get(Am_WIDTH) - 5;
  else
    return 470;
}